

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O1

bool __thiscall cmGeneratorTarget::MacOSXUseInstallNameDir(cmGeneratorTarget *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  cmGlobalGenerator *this_00;
  bool bVar2;
  PolicyStatus PVar3;
  cmValue cVar4;
  string *target;
  char *extraout_RDX;
  char *extraout_RDX_00;
  char *pcVar5;
  string_view value;
  string local_40;
  
  paVar1 = &local_40.field_2;
  local_40._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_40,"BUILD_WITH_INSTALL_NAME_DIR","");
  cVar4 = GetProperty(this,&local_40);
  pcVar5 = extraout_RDX;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != paVar1) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
    pcVar5 = extraout_RDX_00;
  }
  if (cVar4.Value == (string *)0x0) {
    PVar3 = cmPolicies::PolicyMap::Get(&this->PolicyMap,CMP0068);
    if (PVar3 == NEW) {
      bVar2 = false;
    }
    else {
      local_40._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_40,"BUILD_WITH_INSTALL_RPATH","");
      bVar2 = cmTarget::GetPropertyAsBool(this->Target,&local_40);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_40._M_dataplus._M_p != paVar1) {
        operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
      }
      if (bVar2 && PVar3 == WARN) {
        this_00 = this->LocalGenerator->GlobalGenerator;
        target = cmTarget::GetName_abi_cxx11_(this->Target);
        cmGlobalGenerator::AddCMP0068WarnTarget(this_00,target);
      }
    }
  }
  else {
    value._M_str = pcVar5;
    value._M_len = (size_t)((cVar4.Value)->_M_dataplus)._M_p;
    bVar2 = cmValue::IsOn((cmValue *)(cVar4.Value)->_M_string_length,value);
  }
  return bVar2;
}

Assistant:

bool cmGeneratorTarget::MacOSXUseInstallNameDir() const
{
  cmValue build_with_install_name =
    this->GetProperty("BUILD_WITH_INSTALL_NAME_DIR");
  if (build_with_install_name) {
    return cmIsOn(*build_with_install_name);
  }

  cmPolicies::PolicyStatus cmp0068 = this->GetPolicyStatusCMP0068();
  if (cmp0068 == cmPolicies::NEW) {
    return false;
  }

  bool use_install_name = this->GetPropertyAsBool("BUILD_WITH_INSTALL_RPATH");

  if (use_install_name && cmp0068 == cmPolicies::WARN) {
    this->LocalGenerator->GetGlobalGenerator()->AddCMP0068WarnTarget(
      this->GetName());
  }

  return use_install_name;
}